

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program_types.cpp
# Opt level: O1

uint32 __thiscall Clasp::Asp::RuleTransform::Impl::transformDisjunction(Impl *this,AtomSpan *atoms)

{
  size_t sVar1;
  uint *puVar2;
  uint32 uVar3;
  ulong uVar4;
  uint32 uVar5;
  long lVar6;
  size_type sVar7;
  uint *puVar8;
  uint local_5c;
  AtomSpan *local_58;
  AtomSpan local_50;
  LitSpan local_40;
  
  sVar7 = (this->lits_).ebo_.size;
  sVar1 = atoms->size;
  local_58 = atoms;
  if (sVar1 != 1) {
    puVar2 = atoms->first;
    lVar6 = 4;
    do {
      local_50.first = (uint *)CONCAT44(local_50.first._4_4_,-*(int *)((long)puVar2 + lVar6));
      bk_lib::pod_vector<int,_std::allocator<int>_>::push_back(&this->lits_,(int *)&local_50);
      lVar6 = lVar6 + 4;
    } while (sVar1 << 2 != lVar6);
  }
  puVar2 = local_58->first;
  sVar1 = local_58->size;
  uVar5 = 0;
  puVar8 = puVar2;
  while( true ) {
    local_5c = *puVar8;
    local_40.size = (size_t)(this->lits_).ebo_.size;
    local_40.first = (int *)local_40.size;
    if ((pointer)local_40.size != (pointer)0x0) {
      local_40.first = (this->lits_).ebo_.buf;
    }
    local_50.size = (size_t)(local_5c != 0);
    local_50.first = &local_5c;
    uVar3 = addRule(this,(Head_t)0x0,&local_50,&local_40);
    uVar5 = uVar5 + uVar3;
    if (puVar8 + 1 == puVar2 + sVar1) break;
    uVar4 = (ulong)sVar7;
    sVar7 = sVar7 + 1;
    (this->lits_).ebo_.buf[uVar4] = -*puVar8;
    puVar8 = puVar8 + 1;
  }
  return uVar5;
}

Assistant:

uint32 RuleTransform::Impl::transformDisjunction(const Potassco::AtomSpan& atoms) {
	uint32 bIdx = sizeVec(lits_);
	for (Potassco::AtomSpan::iterator it = Potassco::begin(atoms) + 1, end = Potassco::end(atoms); it != end; ++it) {
		lits_.push_back(Potassco::neg(*it));
	}
	uint32 nRule = 0;
	for (Potassco::AtomSpan::iterator it = Potassco::begin(atoms), end = Potassco::end(atoms);;) {
		nRule += addRule(*it, Potassco::toSpan(lits_));
		if (++it == end) { break; }
		lits_[bIdx++] = Potassco::neg(*(it-1));
	}
	return nRule;
}